

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O2

void __thiscall docopt::value::value(value *this,value *other)

{
  Variant *this_00;
  Kind KVar1;
  size_type sVar2;
  
  KVar1 = other->kind;
  this->kind = KVar1;
  if (KVar1 - Bool < 4) {
    this_00 = &this->variant;
    switch(KVar1) {
    case Bool:
      this_00->boolValue = (other->variant).boolValue;
      return;
    case Long:
      this_00->longValue = (other->variant).longValue;
      break;
    case String:
      std::__cxx11::string::string
                ((string *)&this_00->strValue,(string *)&(other->variant).strValue);
      return;
    case StringList:
      sVar2 = (other->variant).strValue._M_string_length;
      (this->variant).longValue = (other->variant).longValue;
      (this->variant).strValue._M_string_length = sVar2;
      (this->variant).strList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (other->variant).strList.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (other->variant).longValue = 0;
      (other->variant).strValue._M_string_length = 0;
      (other->variant).strList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return;
    }
  }
  return;
}

Assistant:

inline
	value::value(value&& other) noexcept
	: kind(other.kind)
	{
		switch (kind) {
			case Kind::String:
				new (&variant.strValue) std::string(std::move(other.variant.strValue));
				break;

			case Kind::StringList:
				new (&variant.strList) std::vector<std::string>(std::move(other.variant.strList));
				break;

			case Kind::Bool:
				variant.boolValue = other.variant.boolValue;
				break;

			case Kind::Long:
				variant.longValue = other.variant.longValue;
				break;

			case Kind::Empty:
			default:
				break;
		}
	}